

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::validateBinaryenIR(wasm::Module&,wasm::ValidationInfo&)::BinaryenIRValidator::
visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  undefined8 *puVar1;
  Type right;
  Type left;
  ValidationInfo *pVVar2;
  bool bVar3;
  ostream *poVar4;
  Function *in_RCX;
  bool bVar5;
  __ireturn_type _Var6;
  Name name;
  Name name_00;
  Visitor<wasm::ReFinalizeNode,_void> local_200 [8];
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 auStack_48 [8];
  Name scope;
  Expression *curr_local;
  
  puVar1 = *(undefined8 **)((long)this + 200);
  scope.super_IString.str._M_str = (char *)curr;
  if (puVar1 == (undefined8 *)0x0) {
    Name::Name((Name *)auStack_48,"(global scope)");
  }
  else {
    auStack_48 = (undefined1  [8])*puVar1;
    scope.super_IString.str._M_len = puVar1[1];
  }
  right.id = (curr->type).id;
  Visitor<wasm::ReFinalizeNode,_void>::visit(local_200,curr);
  left.id = (curr->type).id;
  if (left.id == right.id) goto LAB_00a47b3d;
  bVar5 = false;
  if (((ulong)curr->_id < 0x32) &&
     (in_RCX = (Function *)0x200000000000e, bVar5 = false,
     (0x200000000000eU >> ((ulong)curr->_id & 0x3f) & 1) != 0)) {
    bVar5 = left.id == 1 && 1 < right.id;
  }
  bVar3 = wasm::Type::isSubType(left,right);
  if (bVar3) {
    if (left.id == 1 && !bVar5) {
LAB_00a47a6c:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      poVar4 = std::operator<<((ostream *)local_200,"stale type found in ");
      name.super_IString.str._M_str = (char *)in_RCX;
      name.super_IString.str._M_len = scope.super_IString.str._M_len;
      poVar4 = wasm::operator<<((wasm *)poVar4,(ostream *)auStack_48,name);
      poVar4 = std::operator<<(poVar4," on ");
      poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
      poVar4 = std::operator<<(poVar4,"\n(marked as ");
      poVar4 = wasm::operator<<(poVar4,right);
      poVar4 = std::operator<<(poVar4,", should be ");
      poVar4 = wasm::operator<<(poVar4,left);
      std::operator<<(poVar4,")\n");
      pVVar2 = *(ValidationInfo **)((long)this + 0xd8);
      std::__cxx11::stringbuf::str();
      in_RCX = *(Function **)((long)this + 200);
      ValidationInfo::fail<wasm::Expression*,std::__cxx11::string>(pVVar2,&local_88,curr,in_RCX);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    }
  }
  else if (!bVar5) goto LAB_00a47a6c;
  (curr->type).id = right.id;
LAB_00a47b3d:
  _Var6 = std::__detail::
          _Insert_base<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)((long)this + 0xe0),(value_type *)&scope.super_IString.str._M_str);
  if (((undefined1  [16])_Var6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    poVar4 = std::operator<<((ostream *)local_200,"expression seen more than once in the tree in ");
    name_00.super_IString.str._M_str = (char *)in_RCX;
    name_00.super_IString.str._M_len = scope.super_IString.str._M_len;
    poVar4 = wasm::operator<<((wasm *)poVar4,(ostream *)auStack_48,name_00);
    poVar4 = std::operator<<(poVar4," on ");
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    std::operator<<(poVar4,'\n');
    pVVar2 = *(ValidationInfo **)((long)this + 0xd8);
    std::__cxx11::stringbuf::str();
    ValidationInfo::fail<wasm::Expression*,std::__cxx11::string>
              (pVVar2,&local_68,(Expression *)scope.super_IString.str._M_str,
               *(Function **)((long)this + 200));
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      auto scope = getFunction() ? getFunction()->name : Name("(global scope)");
      // check if a node type is 'stale', i.e., we forgot to finalize() the
      // node.
      auto oldType = curr->type;
      ReFinalizeNode().visit(curr);
      auto newType = curr->type;
      if (newType != oldType) {
        // We accept concrete => undefined on control flow structures:
        // e.g.
        //
        //  (drop (block (result i32) (unreachable)))
        //
        // The block has a type annotated on it, which can make its unreachable
        // contents have a concrete type. Refinalize will make it unreachable,
        // so both are valid here.
        bool validControlFlowStructureChange =
          Properties::isControlFlowStructure(curr) && oldType.isConcrete() &&
          newType == Type::unreachable;
        // It's ok in general for types to get refined as long as they don't
        // become unreachable.
        bool validRefinement =
          Type::isSubType(newType, oldType) && newType != Type::unreachable;
        if (!validRefinement && !validControlFlowStructureChange) {
          std::ostringstream ss;
          ss << "stale type found in " << scope << " on " << curr
             << "\n(marked as " << oldType << ", should be " << newType
             << ")\n";
          info.fail(ss.str(), curr, getFunction());
        }
        curr->type = oldType;
      }
      // check if a node is a duplicate - expressions must not be seen more than
      // once
      if (!seen.insert(curr).second) {
        std::ostringstream ss;
        ss << "expression seen more than once in the tree in " << scope
           << " on " << curr << '\n';
        info.fail(ss.str(), curr, getFunction());
      }
    }